

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

IRIns * lj_snap_regspmap(jit_State *J,GCtrace *T,SnapNo snapno,IRIns *ir)

{
  uint uVar1;
  SnapEntry *pSVar2;
  RegSP RVar3;
  BloomFilter BVar4;
  ushort local_4c;
  uint local_48;
  uint32_t rs;
  IRRef ref;
  MSize n;
  BloomFilter rfilt;
  SnapEntry *map;
  SnapShot *snap;
  IRIns *ir_local;
  SnapNo snapno_local;
  GCtrace *T_local;
  jit_State *J_local;
  
  pSVar2 = T->snapmap;
  uVar1 = T->snap[snapno].mapofs;
  BVar4 = snap_renamefilter(T,snapno);
  rs = 0;
  snap = (SnapShot *)ir;
  do {
    if (*(char *)((long)&snap->ref + 1) == 'G') {
      if ((snap->mapofs & 0x10000) == 0) {
        return (IRIns *)snap;
      }
      while (pSVar2[(ulong)uVar1 + (ulong)rs] >> 0x18 != (uint)(ushort)snap->mapofs) {
        rs = rs + 1;
      }
      local_48 = pSVar2[(ulong)uVar1 + (ulong)rs] & 0xffff;
      rs = rs + 1;
    }
    else {
      if (*(char *)((long)&snap->ref + 1) != '\x0e') {
        return (IRIns *)snap;
      }
      local_48 = (ushort)snap->mapofs + 0x8000;
    }
    local_4c = *(ushort *)((long)T->ir + (ulong)local_48 * 8 + 6);
    if ((BVar4 & 1L << ((byte)local_48 & 0x3f)) != 0) {
      RVar3 = snap_renameref(T,snapno,local_48,(uint)local_4c);
      local_4c = (ushort)RVar3;
    }
    snap->mcofs = local_4c;
    snap = (SnapShot *)&snap->nslots;
  } while( true );
}

Assistant:

IRIns *lj_snap_regspmap(jit_State *J, GCtrace *T, SnapNo snapno, IRIns *ir)
{
  SnapShot *snap = &T->snap[snapno];
  SnapEntry *map = &T->snapmap[snap->mapofs];
  BloomFilter rfilt = snap_renamefilter(T, snapno);
  MSize n = 0;
  IRRef ref = 0;
  UNUSED(J);
  for ( ; ; ir++) {
    uint32_t rs;
    if (ir->o == IR_SLOAD) {
      if (!(ir->op2 & IRSLOAD_PARENT)) break;
      for ( ; ; n++) {
	lj_assertJ(n < snap->nent, "slot %d not found in snapshot", ir->op1);
	if (snap_slot(map[n]) == ir->op1) {
	  ref = snap_ref(map[n++]);
	  break;
	}
      }
    } else if (LJ_SOFTFP32 && ir->o == IR_HIOP) {
      ref++;
    } else if (ir->o == IR_PVAL) {
      ref = ir->op1 + REF_BIAS;
    } else {
      break;
    }
    rs = T->ir[ref].prev;
    if (bloomtest(rfilt, ref))
      rs = snap_renameref(T, snapno, ref, rs);
    ir->prev = (uint16_t)rs;
    lj_assertJ(regsp_used(rs), "unused IR %04d in snapshot", ref - REF_BIAS);
  }
  return ir;
}